

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serialization.h
# Opt level: O3

void tsbp::Serializer::WriteToJson<tsbp::Packing2D>(Packing2D *classToSerialize,string *filePath)

{
  pointer pcVar1;
  char cVar2;
  undefined8 *puVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream ofs;
  undefined1 local_248 [8];
  json_value local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  undefined4 local_228;
  undefined8 local_220;
  long local_218;
  filebuf local_210 [8];
  undefined8 auStack_208 [29];
  ios_base local_120 [264];
  
  pcVar1 = (filePath->_M_dataplus)._M_p;
  local_248 = (undefined1  [8])(local_248 + 0x10);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_248,pcVar1,pcVar1 + filePath->_M_string_length);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,".json")
  ;
  std::ofstream::ofstream(&local_218,(string *)local_248,_S_out);
  if (local_248 != (undefined1  [8])(local_248 + 0x10)) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
  }
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    local_248 = (undefined1  [8])((ulong)local_248 & 0xffffffffffffff00);
    local_240.object = (object_t *)0x0;
    to_json((json *)local_248,classToSerialize);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_248);
    *(undefined8 *)((long)auStack_208 + *(long *)(local_218 + -0x18)) = 2;
    nlohmann::operator<<
              ((ostream *)&local_218,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                *)local_248);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *)local_248);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)(local_248 + 8),(value_t)local_248[0]);
    std::ofstream::close();
    local_218 = _VTT;
    *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_210);
    std::ios_base::~ios_base(local_120);
    return;
  }
  local_220 = std::iostream_category();
  local_228 = 1;
  std::ios_base::failure[abi:cxx11]::failure(local_248,(error_code *)"File stream not open.");
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &__cxxabiv1::__pointer_type_info::vtable;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

static void WriteToJson(T& classToSerialize, const std::string& filePath)
    {
        std::ofstream ofs(filePath + ".json");
        {
            if (!ofs.is_open())
            {
                auto ex = std::ios_base::failure("File stream not open.");
                throw std::exception(ex);
            }

            json jsonFile = classToSerialize;
            ofs << std::setw(2) << jsonFile;
        }

        ofs.close();
    }